

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

void draw_detections(yolo_image *im,vector<detection,_std::allocator<detection>_> *dets,float thresh
                    ,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *labels,vector<yolo_image,_std::allocator<yolo_image>_> *alphabet)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<detection,_std::allocator<detection>_> *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  float w;
  float r;
  float g;
  yolo_image label;
  int bot;
  int top;
  int right;
  int left;
  box b;
  float rgb [3];
  float blue;
  float green;
  float red;
  int offset;
  int width;
  int j;
  int cl;
  string labelstr;
  int i;
  int classes;
  float in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  int y1;
  int x1;
  yolo_image *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  yolo_image *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  float local_94;
  float fStack_90;
  float local_8c;
  float fStack_88;
  int local_58;
  int size;
  string *in_stack_ffffffffffffffb0;
  vector<yolo_image,_std::allocator<yolo_image>_> *in_stack_ffffffffffffffb8;
  int local_30;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(in_RDX);
  local_30 = 0;
  while (x1 = local_30, sVar5 = std::vector<detection,_std::allocator<detection>_>::size(in_RSI),
        x1 < (int)sVar5) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb0);
    size = -1;
    local_58 = 0;
    while( true ) {
      y1 = local_58;
      pvVar6 = std::vector<detection,_std::allocator<detection>_>::operator[](in_RSI,(long)local_30)
      ;
      sVar5 = std::vector<float,_std::allocator<float>_>::size(&pvVar6->prob);
      if ((int)sVar5 <= y1) break;
      pvVar6 = std::vector<detection,_std::allocator<detection>_>::operator[](in_RSI,(long)local_30)
      ;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&pvVar6->prob,(long)local_58);
      if (in_XMM0_Da < *pvVar7) {
        if (size < 0) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](in_RDX,(long)local_58);
          std::__cxx11::string::operator=((string *)&stack0xffffffffffffffb0,(string *)pvVar8);
          size = local_58;
        }
        else {
          std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb0,", ");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](in_RDX,(long)local_58);
          std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb0,(string *)pvVar8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDX,(long)local_58);
        in_stack_ffffffffffffff20 = std::__cxx11::string::c_str();
        pvVar6 = std::vector<detection,_std::allocator<detection>_>::operator[]
                           (in_RSI,(long)local_30);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pvVar6->prob,(long)local_58);
        printf("%s: %.0f%%\n",(double)(*pvVar7 * 100.0),in_stack_ffffffffffffff20);
      }
      local_58 = local_58 + 1;
    }
    if (-1 < size) {
      w = get_color(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      r = get_color(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      g = get_color(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      pvVar6 = std::vector<detection,_std::allocator<detection>_>::operator[](in_RSI,(long)local_30)
      ;
      uVar1 = (pvVar6->bbox).x;
      uVar3 = (pvVar6->bbox).y;
      uVar2 = (pvVar6->bbox).w;
      uVar4 = (pvVar6->bbox).h;
      in_stack_ffffffffffffff64 = (int)(((float)uVar1 + (float)uVar2 / 2.0) * (float)*in_RDI);
      in_stack_ffffffffffffff60 = (int)(((float)uVar3 - (float)uVar4 / 2.0) * (float)in_RDI[1]);
      in_stack_ffffffffffffff5c = (int)(((float)uVar3 + (float)uVar4 / 2.0) * (float)in_RDI[1]);
      if (*in_RDI + -1 < in_stack_ffffffffffffff64) {
        in_stack_ffffffffffffff64 = *in_RDI + -1;
      }
      if (in_stack_ffffffffffffff60 < 0) {
        in_stack_ffffffffffffff60 = 0;
      }
      if (in_RDI[1] + -1 < in_stack_ffffffffffffff5c) {
        in_stack_ffffffffffffff5c = in_RDI[1] + -1;
      }
      draw_box_width(in_stack_ffffffffffffff30,x1,y1,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20)
                     ,(int)in_stack_ffffffffffffff20,(int)w,r,g,in_stack_ffffffffffffff10);
      get_label(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,size);
      draw_label(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30,(float *)CONCAT44(x1,y1));
      yolo_image::~yolo_image((yolo_image *)0x108c91);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

static void draw_detections(yolo_image & im, const std::vector<detection> & dets, float thresh, const std::vector<std::string> & labels, const std::vector<yolo_image> & alphabet)
{
    int classes = (int)labels.size();
    for (int i = 0; i < (int)dets.size(); i++) {
        std::string labelstr;
        int cl = -1;
        for (int j = 0; j < (int)dets[i].prob.size(); j++) {
            if (dets[i].prob[j] > thresh) {
                if (cl < 0) {
                    labelstr = labels[j];
                    cl = j;
                } else {
                    labelstr += ", ";
                    labelstr += labels[j];
                }
                printf("%s: %.0f%%\n", labels[j].c_str(), dets[i].prob[j]*100);
            }
        }
        if (cl >= 0) {
            int width = im.h * .006;
            int offset = cl*123457 % classes;
            float red = get_color(2,offset,classes);
            float green = get_color(1,offset,classes);
            float blue = get_color(0,offset,classes);
            float rgb[3];

            rgb[0] = red;
            rgb[1] = green;
            rgb[2] = blue;
            box b = dets[i].bbox;

            int left  = (b.x-b.w/2.)*im.w;
            int right = (b.x+b.w/2.)*im.w;
            int top   = (b.y-b.h/2.)*im.h;
            int bot   = (b.y+b.h/2.)*im.h;

            if (left < 0) left = 0;
            if (right > im.w-1) right = im.w-1;
            if (top < 0) top = 0;
            if (bot > im.h-1) bot = im.h-1;

            draw_box_width(im, left, top, right, bot, width, red, green, blue);
            yolo_image label = get_label(alphabet, labelstr, (im.h*.03));
            draw_label(im, top + width, left, label, rgb);
        }
    }
}